

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void presolve::HPresolve::debug(HighsLp *lp,HighsOptions *options)

{
  size_t sVar1;
  pointer *ppdVar2;
  vector<int,_std::allocator<int>_> *Astart;
  vector<int,_std::allocator<int>_> *Aindex;
  vector<double,_std::allocator<double>_> *Avalue;
  int iVar3;
  size_t sVar4;
  HighsLp *pHVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  HighsModelStatus HVar9;
  _Rb_tree_header *p_Var10;
  ulong uVar11;
  size_t sVar12;
  ulong local_69d8;
  size_t local_69c8;
  size_t reductionLim;
  HighsLp *local_69b8;
  HighsSolution sol;
  vector<int,_std::allocator<int>_> Aend;
  HighsSolution reducedsol;
  HighsBasis local_6848;
  string local_67e8;
  undefined1 local_67c8 [16];
  _Alloc_hider local_67b8;
  size_type local_67b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_67a8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_6798;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> vStack_6780;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> flagRow;
  vector<int,_std::allocator<int>_> flagCol;
  undefined4 *local_66d0;
  undefined8 local_66c8;
  undefined4 local_66c0;
  undefined1 local_66bc;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_66b0;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> vStack_6698;
  HighsSolution temp_sol;
  HighsPostsolveStack tmp;
  KktInfo kktinfo;
  HighsPostsolveStack postsolve_stack;
  HighsLp model;
  HPresolve presolve;
  State local_59c8;
  HighsLp local_5920;
  HighsLp local_5588;
  Highs highs;
  
  reducedsol.value_valid = false;
  reducedsol.dual_valid = false;
  reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_66d0 = &local_66c0;
  local_66c0 = 0x656e6f4e;
  local_66c8 = 4;
  local_66bc = 0;
  local_66b0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_66b0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_66b0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_6698.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_6698.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_6698.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sol.value_valid = false;
  sol.dual_valid = false;
  sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_67b8._M_p = (pointer)&local_67a8;
  local_67c8[0] = false;
  local_67c8[1] = true;
  local_67c8[2] = false;
  local_67c8[3] = true;
  local_67c8._4_4_ = -1;
  local_67c8._8_4_ = -1;
  local_67a8._M_allocated_capacity._0_4_ = 0x656e6f4e;
  local_67b0 = 4;
  local_67a8._M_local_buf[4] = '\0';
  local_6798.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6798.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6798.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_6780.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_6780.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_6780.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsLp::HighsLp(&model,lp);
  highs._vptr_Highs._0_4_ = (uint)highs._vptr_Highs & 0xffffff00;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
            (&model.integrality_,(long)lp->num_col_,(value_type *)&highs);
  postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postsolve_stack.debug_prev_row_upper = 0.0;
  postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  postsolve_stack.debug_prev_col_upper = 0.0;
  postsolve_stack.debug_prev_row_lower = 0.0;
  postsolve_stack.debug_prev_numreductions = 0;
  postsolve_stack.debug_prev_col_lower = 0.0;
  memset(&postsolve_stack.reductions,0,0x90);
  postsolve_stack.origNumCol = -1;
  postsolve_stack.origNumRow = -1;
  HighsPostsolveStack::initializeIndexMaps(&postsolve_stack,lp->num_row_,lp->num_col_);
  presolve.mipsolver = (HighsMipSolver *)0x0;
  memset(&presolve.impliedDualRowBounds,0,0xc0);
  memset(&presolve.Avalue,0,0x348);
  presolve.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.liftingOpportunities._M_h._M_bucket_count = 1;
  presolve.liftingOpportunities._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  presolve.liftingOpportunities._M_h._M_element_count = 0;
  presolve.liftingOpportunities._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  presolve.liftingOpportunities._M_h._M_rehash_policy._M_next_resize = 0;
  presolve.liftingOpportunities._M_h._M_single_bucket = (__node_base_ptr)0x0;
  presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header;
  presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  presolve.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.equations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  presolve.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  presolve.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  presolve.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  presolve.liftingOpportunities._M_h._M_buckets =
       &presolve.liftingOpportunities._M_h._M_single_bucket;
  presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  okSetInput(&presolve,&model,options,(options->super_HighsOptionsStruct).presolve_reduction_limit,
             (HighsTimer *)0x0);
  HVar9 = run(&presolve,&postsolve_stack);
  if (HVar9 == kMin) {
    Highs::Highs(&highs);
    HighsLp::HighsLp(&local_5920,&model);
    Highs::passModel(&highs,&local_5920);
    HighsLp::~HighsLp(&local_5920);
    Highs::passOptions(&highs,options);
    tmp.debug_prev_numreductions = (size_t)&tmp.debug_prev_col_upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tmp,"presolve","");
    Highs::setOptionValue(&highs,(string *)&tmp,&::kHighsOffString_abi_cxx11_);
    if ((double *)tmp.debug_prev_numreductions != &tmp.debug_prev_col_upper) {
      operator_delete((void *)tmp.debug_prev_numreductions);
    }
    Highs::run(&highs);
    if (highs.model_status_ == kOptimal) {
      reducedsol.value_valid = highs.solution_.value_valid;
      reducedsol.dual_valid = highs.solution_.dual_valid;
      std::vector<double,_std::allocator<double>_>::operator=
                (&reducedsol.col_value,&highs.solution_.col_value);
      std::vector<double,_std::allocator<double>_>::operator=
                (&reducedsol.col_dual,&highs.solution_.col_dual);
      std::vector<double,_std::allocator<double>_>::operator=
                (&reducedsol.row_value,&highs.solution_.row_value);
      std::vector<double,_std::allocator<double>_>::operator=
                (&reducedsol.row_dual,&highs.solution_.row_dual);
      std::__cxx11::string::_M_assign((string *)&local_66d0);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&local_66b0,&highs.basis_.col_status);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&vStack_6698,&highs.basis_.row_status);
      Highs::~Highs(&highs);
      ~HPresolve(&presolve);
      HighsLp::operator=(&model,lp);
      sol.value_valid = reducedsol.value_valid;
      sol.dual_valid = reducedsol.dual_valid;
      std::vector<double,_std::allocator<double>_>::operator=(&sol.col_value,&reducedsol.col_value);
      std::vector<double,_std::allocator<double>_>::operator=(&sol.col_dual,&reducedsol.col_dual);
      std::vector<double,_std::allocator<double>_>::operator=(&sol.row_value,&reducedsol.row_value);
      std::vector<double,_std::allocator<double>_>::operator=(&sol.row_dual,&reducedsol.row_dual);
      local_67c8._8_4_ = highs.basis_.debug_update_count;
      local_67c8[0] = highs.basis_.valid;
      local_67c8[1] = highs.basis_.alien;
      local_67c8[2] = highs.basis_.useful;
      local_67c8[3] = highs.basis_.was_alien;
      local_67c8._4_4_ = highs.basis_.debug_id;
      std::__cxx11::string::_M_assign((string *)&local_67b8);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&local_6798,&local_66b0);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                (&vStack_6780,&vStack_6698);
      HighsPostsolveStack::undo(&postsolve_stack,options,&sol,(HighsBasis *)local_67c8,-1);
      refineBasis(lp,&sol,(HighsBasis *)local_67c8);
      calculateRowValuesQuad(&model,&sol,-1);
      highs._vptr_Highs._0_4_ = 1;
      std::vector<int,_std::allocator<int>_>::vector
                (&flagCol,(long)lp->num_col_,(value_type_conflict2 *)&highs,
                 (allocator_type *)&presolve);
      highs._vptr_Highs._0_4_ = 1;
      std::vector<int,_std::allocator<int>_>::vector
                (&flagRow,(long)lp->num_row_,(value_type_conflict2 *)&highs,
                 (allocator_type *)&presolve);
      Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      dev_kkt_check::initInfo();
      local_69b8 = lp;
      std::vector<int,std::allocator<int>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&Aend,
                 model.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,
                 model.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      Astart = &model.a_matrix_.start_;
      Aindex = &model.a_matrix_.index_;
      Avalue = &model.a_matrix_.value_;
      highsSparseTranspose
                (model.num_row_,model.num_col_,Astart,Aindex,Avalue,&ARstart,&ARindex,&ARvalue);
      local_59c8.rowUpper = &model.row_upper_;
      local_59c8.Aend = &Aend;
      local_59c8.colCost = &model.col_cost_;
      local_59c8.colLower = &model.col_lower_;
      local_59c8.colUpper = &model.col_upper_;
      local_59c8.rowLower = &model.row_lower_;
      local_59c8.flagCol = &flagCol;
      local_59c8.flagRow = &flagRow;
      local_59c8.colValue = &sol.col_value;
      local_59c8.colDual = &sol.col_dual;
      local_59c8.rowValue = &sol.row_value;
      local_59c8.rowDual = &sol.row_dual;
      local_59c8.col_status = &local_6798;
      local_59c8.row_status = &vStack_6780;
      local_59c8.Astart = Astart;
      local_59c8.Aindex = Aindex;
      local_59c8.Avalue = Avalue;
      local_59c8.ARstart = &ARstart;
      local_59c8.ARindex = &ARindex;
      local_59c8.ARvalue = &ARvalue;
      bVar8 = dev_kkt_check::checkKkt(&local_59c8,&kktinfo);
      if ((bVar8) && (kktinfo.pass_bfs == true)) {
        puts("kkt check of postsolved solution and basis passed");
      }
      else {
        local_69d8 = (long)postsolve_stack.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)postsolve_stack.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
        reductionLim = local_69d8 >> 1;
        ppdVar2 = (pointer *)
                  ((long)&highs.presolved_model_.lp_.col_cost_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + 8);
        p_Var10 = &presolve.equations._M_t._M_impl.super__Rb_tree_header;
        local_69c8 = 0;
        do {
          pHVar5 = local_69b8;
          HighsLp::operator=(&model,local_69b8);
          highs._vptr_Highs._0_4_ = (uint)highs._vptr_Highs & 0xffffff00;
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
                    (&model.integrality_,(long)pHVar5->num_col_,(value_type *)&highs);
          highs.solution_.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          memset((pointer *)
                 ((long)&highs.model_.lp_.mods_.save_non_semi_variable_index.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8),0,0xc0);
          memset(&highs.solution_.col_dual,0,0x348);
          highs.model_.lp_.mods_.save_inf_cost_variable_cost.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_cost.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_lower.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_lower.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_lower.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_upper.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_upper.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          highs.model_.lp_.mods_.save_inf_cost_variable_upper.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          highs.model_.hessian_.dim_ = 0;
          highs.model_.hessian_.format_ = 0;
          highs.model_.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          highs.model_.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.model_.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.model_.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          highs.model_.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.model_.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.model_.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
          highs.model_.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.multi_linear_objective_.
          super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          highs.multi_linear_objective_.
          super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0x3f800000;
          highs.multi_linear_objective_.
          super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.num_col_ = 0;
          highs.presolved_model_.lp_.num_row_ = 0;
          highs.presolved_model_.lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          highs.presolved_model_.lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.objective_name_.field_2._M_allocated_capacity = 0;
          highs.presolved_model_.lp_.objective_name_.field_2._8_4_ = 0;
          highs.presolved_model_.lp_.new_col_name_ix_ = 0;
          highs.presolved_model_.lp_.new_row_name_ix_ = 0;
          highs.presolved_model_.lp_.col_names_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          highs.presolved_model_.lp_.col_names_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.integrality_.
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          highs.presolved_model_.lp_.row_names_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.row_names_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.p_end_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.p_end_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.p_end_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.a_matrix_.format_ = 0;
          highs.presolved_model_.lp_.a_matrix_.num_col_ = 0;
          highs.presolved_model_.lp_.a_matrix_.num_row_ = 0;
          highs.presolved_model_.lp_.a_matrix_._12_4_ = 0;
          highs.presolved_model_.lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          highs.presolved_model_.lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          highs.presolved_model_.lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          highs.model_.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&highs.presolved_model_;
          highs.presolved_model_.lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)ppdVar2;
          highs.presolved_model_.lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)ppdVar2;
          okSetInput((HPresolve *)&highs,&model,options,
                     (options->super_HighsOptionsStruct).presolve_reduction_limit,(HighsTimer *)0x0)
          ;
          computeIntermediateMatrix((HPresolve *)&highs,&flagRow,&flagCol,&reductionLim);
          ~HPresolve((HPresolve *)&highs);
          pHVar5 = local_69b8;
          HighsLp::operator=(&model,local_69b8);
          highs._vptr_Highs._0_4_ = (uint)highs._vptr_Highs & 0xffffff00;
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_fill_assign
                    (&model.integrality_,(long)pHVar5->num_col_,(value_type *)&highs);
          presolve.mipsolver = (HighsMipSolver *)0x0;
          memset(&presolve.impliedDualRowBounds,0,0xc0);
          memset(&presolve.Avalue,0,0x348);
          presolve.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.substitutionOpportunities.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.substitutionOpportunities.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.substitutionOpportunities.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.liftingOpportunities._M_h._M_bucket_count = 1;
          presolve.liftingOpportunities._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          presolve.liftingOpportunities._M_h._M_element_count = 0;
          presolve.liftingOpportunities._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          presolve.liftingOpportunities._M_h._M_rehash_policy._M_next_resize = 0;
          presolve.liftingOpportunities._M_h._M_single_bucket = (__node_base_ptr)0x0;
          presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          presolve.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          presolve.analysis_.presolve_log_.rule.
          super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.analysis_.presolve_log_.rule.
          super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.analysis_.presolve_log_.rule.
          super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.eqiters.
          super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.eqiters.
          super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.equations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          presolve.eqiters.
          super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          presolve.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          presolve.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          presolve.liftingOpportunities._M_h._M_buckets =
               &presolve.liftingOpportunities._M_h._M_single_bucket;
          presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var10->_M_header;
          presolve.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var10->_M_header;
          okSetInput(&presolve,&model,options,
                     (options->super_HighsOptionsStruct).presolve_reduction_limit,(HighsTimer *)0x0)
          ;
          tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          tmp.debug_prev_row_upper = 0.0;
          tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          tmp.debug_prev_col_upper = 0.0;
          tmp.debug_prev_row_lower = 0.0;
          tmp.debug_prev_numreductions = 0;
          tmp.debug_prev_col_lower = 0.0;
          memset(&tmp.reductions,0,0x90);
          tmp.origNumCol = -1;
          tmp.origNumRow = -1;
          HighsPostsolveStack::initializeIndexMaps(&tmp,model.num_row_,model.num_col_);
          sVar4 = reductionLim;
          presolve.reductionLimit = reductionLim;
          run(&presolve,&tmp);
          sol.value_valid = reducedsol.value_valid;
          sol.dual_valid = reducedsol.dual_valid;
          std::vector<double,_std::allocator<double>_>::operator=
                    (&sol.col_value,&reducedsol.col_value);
          std::vector<double,_std::allocator<double>_>::operator=
                    (&sol.col_dual,&reducedsol.col_dual);
          std::vector<double,_std::allocator<double>_>::operator=
                    (&sol.row_value,&reducedsol.row_value);
          std::vector<double,_std::allocator<double>_>::operator=
                    (&sol.row_dual,&reducedsol.row_dual);
          local_67c8._8_4_ = highs.basis_.debug_update_count;
          local_67c8[0] = highs.basis_.valid;
          local_67c8[1] = highs.basis_.alien;
          local_67c8[2] = highs.basis_.useful;
          local_67c8[3] = highs.basis_.was_alien;
          local_67c8._4_4_ = highs.basis_.debug_id;
          std::__cxx11::string::_M_assign((string *)&local_67b8);
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                    (&local_6798,&local_66b0);
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
                    (&vStack_6780,&vStack_6698);
          HighsPostsolveStack::undoUntil
                    (&postsolve_stack,options,&sol,(HighsBasis *)local_67c8,
                     (long)tmp.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tmp.reductions.
                           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
          local_6848.valid = false;
          local_6848.alien = true;
          local_6848.useful = false;
          local_6848.was_alien = true;
          local_6848.debug_id = -1;
          local_6848.debug_update_count = -1;
          local_6848.debug_origin_name._M_dataplus._M_p =
               (pointer)&local_6848.debug_origin_name.field_2;
          local_6848.debug_origin_name.field_2._M_allocated_capacity._0_4_ = 0x656e6f4e;
          local_6848.debug_origin_name._M_string_length = 4;
          local_6848.debug_origin_name.field_2._M_local_buf[4] = '\0';
          local_6848.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_6848.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_6848.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_6848.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_6848.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_6848.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.value_valid = false;
          temp_sol.dual_valid = false;
          temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
                    (&local_6848.col_status,(long)model.num_col_);
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.col_dual,(long)model.num_col_);
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.col_value,(long)model.num_col_);
          if ((ulong)(uint)model.num_col_ != 0) {
            uVar11 = 0;
            do {
              iVar3 = tmp.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
              temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] =
                   sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
              temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] =
                   sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
              local_6848.col_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] =
                   local_6798.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
              uVar11 = uVar11 + 1;
            } while ((uint)model.num_col_ != uVar11);
          }
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
                    (&local_6848.row_status,(long)model.num_row_);
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.row_dual,(long)model.num_row_);
          if ((ulong)(uint)model.num_row_ != 0) {
            uVar11 = 0;
            do {
              iVar3 = tmp.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11];
              temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] =
                   sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
              local_6848.row_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] =
                   vStack_6780.
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
              uVar11 = uVar11 + 1;
            } while ((uint)model.num_row_ != uVar11);
          }
          std::vector<double,_std::allocator<double>_>::resize
                    (&temp_sol.row_value,(long)model.num_row_);
          calculateRowValuesQuad(&model,&sol,-1);
          uVar6 = local_6848._0_8_;
          local_6848.valid = true;
          uVar7 = local_6848._0_8_;
          local_6848._3_5_ = SUB85(uVar6,3);
          local_6848._0_2_ = SUB82(uVar7,0);
          local_6848.useful = true;
          refineBasis(&model,&temp_sol,&local_6848);
          Highs::Highs(&highs);
          Highs::passOptions(&highs,options);
          HighsLp::HighsLp(&local_5588,&model);
          Highs::passModel(&highs,&local_5588);
          HighsLp::~HighsLp(&local_5588);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_6848.debug_origin_name,0,
                     (char *)local_6848.debug_origin_name._M_string_length,0x3d82f2);
          local_67e8._M_dataplus._M_p = (pointer)&local_67e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_67e8,"");
          Highs::setBasis(&highs,&local_6848,&local_67e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_67e8._M_dataplus._M_p != &local_67e8.field_2) {
            operator_delete(local_67e8._M_dataplus._M_p);
          }
          Highs::run(&highs);
          printf("simplex iterations with postsolved basis: %d\n",
                 (ulong)(uint)highs.info_.super_HighsInfoStruct.simplex_iteration_count);
          sVar1 = local_69d8 - 1;
          sVar12 = local_69c8;
          if (local_69c8 != sVar1) {
            sVar12 = sVar4;
            if (highs.info_.super_HighsInfoStruct.simplex_iteration_count == 0) {
              sVar12 = local_69c8;
              local_69d8 = sVar4;
            }
            reductionLim = sVar12 + local_69d8 >> 1;
            printf("binary search ongoing: good=%zu, bad=%zu\n",local_69d8,sVar12);
          }
          Highs::~Highs(&highs);
          if (temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(temp_sol.row_dual.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(temp_sol.row_value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(temp_sol.col_dual.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(temp_sol.col_value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_6848.row_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_6848.row_status.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_6848.col_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_6848.col_status.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6848.debug_origin_name._M_dataplus._M_p !=
              &local_6848.debug_origin_name.field_2) {
            operator_delete(local_6848.debug_origin_name._M_dataplus._M_p);
          }
          if (tmp.colValues.
              super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.colValues.
                            super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (tmp.rowValues.
              super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.rowValues.
                            super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (tmp.linearlyTransformable.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.linearlyTransformable.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (tmp.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (tmp.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (tmp.reductions.
              super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.reductions.
                            super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tmp.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          ~HPresolve(&presolve);
          bVar8 = local_69c8 != sVar1;
          local_69c8 = sVar12;
        } while (bVar8);
        printf("binary search finished: good=%zu, bad=%zu\n",local_69d8,sVar12);
      }
      std::
      _Rb_tree<presolve::dev_kkt_check::KktCondition,_std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>,_std::_Select1st<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
      ::~_Rb_tree((_Rb_tree<presolve::dev_kkt_check::KktCondition,_std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>,_std::_Select1st<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                   *)&kktinfo);
      if (ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_00320e57;
    }
    Highs::~Highs(&highs);
  }
  ~HPresolve(&presolve);
LAB_00320e57:
  if (postsolve_stack.colValues.
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.colValues.
                    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (postsolve_stack.rowValues.
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.rowValues.
                    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (postsolve_stack.linearlyTransformable.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.linearlyTransformable.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (postsolve_stack.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.origRowIndex.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (postsolve_stack.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.origColIndex.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (postsolve_stack.reductions.
      super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.reductions.
                    super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (postsolve_stack.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(postsolve_stack.reductionValues.data.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  HighsLp::~HighsLp(&model);
  if (vStack_6780.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_6780.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_6798.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6798.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_67b8._M_p != &local_67a8) {
    operator_delete(local_67b8._M_p);
  }
  if (sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vStack_6698.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_6698.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_66b0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_66b0.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_66d0 != &local_66c0) {
    operator_delete(local_66d0);
  }
  if (reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reducedsol.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reducedsol.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reducedsol.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(reducedsol.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::debug(const HighsLp& lp, const HighsOptions& options) {
  HighsSolution reducedsol;
  HighsBasis reducedbasis;

  HighsSolution sol;
  HighsBasis basis;

  HighsLp model = lp;
  model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);

  HighsPostsolveStack postsolve_stack;
  postsolve_stack.initializeIndexMaps(lp.num_row_, lp.num_col_);
  {
    HPresolve presolve;
    presolve.okSetInput(model, options, options.presolve_reduction_limit);
    // presolve.setReductionLimit(1622017);
    if (presolve.run(postsolve_stack) != HighsModelStatus::kNotset) return;
    Highs highs;
    highs.passModel(model);
    highs.passOptions(options);
    highs.setOptionValue("presolve", kHighsOffString);
    highs.run();
    if (highs.getModelStatus() != HighsModelStatus::kOptimal) return;
    reducedsol = highs.getSolution();
    reducedbasis = highs.getBasis();
  }
  model = lp;
  sol = reducedsol;
  basis = reducedbasis;
  postsolve_stack.undo(options, sol, basis);
  refineBasis(lp, sol, basis);
  calculateRowValuesQuad(model, sol);
#if 0
  Highs highs;
  highs.passModel(model);
  highs.passOptions(options);
  highs.setSolution(sol);
  basis.debug_origin_name = "HPresolve::debug";
  highs.setBasis(basis);
  highs.run();
  return;
#endif
  std::vector<HighsInt> flagCol(lp.num_col_, 1);
  std::vector<HighsInt> flagRow(lp.num_row_, 1);
  std::vector<HighsInt> Aend;
  std::vector<HighsInt> ARstart;
  std::vector<HighsInt> ARindex;
  std::vector<double> ARvalue;
  dev_kkt_check::KktInfo kktinfo = dev_kkt_check::initInfo();
  Aend.assign(model.a_matrix_.start_.begin() + 1, model.a_matrix_.start_.end());
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart,
                       ARindex, ARvalue);
  dev_kkt_check::State state(
      model.num_col_, model.num_row_, model.a_matrix_.start_, Aend,
      model.a_matrix_.index_, model.a_matrix_.value_, ARstart, ARindex, ARvalue,
      model.col_cost_, model.col_lower_, model.col_upper_, model.row_lower_,
      model.row_upper_, flagCol, flagRow, sol.col_value, sol.col_dual,
      sol.row_value, sol.row_dual, basis.col_status, basis.row_status);
  bool checkResult = dev_kkt_check::checkKkt(state, kktinfo);
  if (checkResult && kktinfo.pass_bfs) {
    printf("kkt check of postsolved solution and basis passed\n");
    return;
  }
  size_t good = postsolve_stack.numReductions();
  size_t bad = 0;
  size_t reductionLim = (good + bad) / 2;

  // good = 1734357, bad = 1734289;
  // good = 1050606, bad = 1050605;
  // good = 1811527, bad = 1811526;
  // reductionLim = bad;
  do {
    model = lp;
    model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);

    {
      HPresolve presolve;
      presolve.okSetInput(model, options, options.presolve_reduction_limit);
      presolve.computeIntermediateMatrix(flagRow, flagCol, reductionLim);
    }
#if 1
    model = lp;
    model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);
    HPresolve presolve;
    presolve.okSetInput(model, options, options.presolve_reduction_limit);
    HighsPostsolveStack tmp;
    tmp.initializeIndexMaps(model.num_row_, model.num_col_);
    presolve.setReductionLimit(reductionLim);
    presolve.run(tmp);

    sol = reducedsol;
    basis = reducedbasis;
    postsolve_stack.undoUntil(options, sol, basis, tmp.numReductions());

    HighsBasis temp_basis;
    HighsSolution temp_sol;
    temp_basis.col_status.resize(model.num_col_);
    temp_sol.col_dual.resize(model.num_col_);
    temp_sol.col_value.resize(model.num_col_);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      temp_sol.col_dual[i] = sol.col_dual[tmp.getOrigColIndex(i)];
      temp_sol.col_value[i] = sol.col_value[tmp.getOrigColIndex(i)];
      temp_basis.col_status[i] = basis.col_status[tmp.getOrigColIndex(i)];
    }

    temp_basis.row_status.resize(model.num_row_);
    temp_sol.row_dual.resize(model.num_row_);
    for (HighsInt i = 0; i != model.num_row_; ++i) {
      temp_sol.row_dual[i] = sol.row_dual[tmp.getOrigRowIndex(i)];
      temp_basis.row_status[i] = basis.row_status[tmp.getOrigRowIndex(i)];
    }
    temp_sol.row_value.resize(model.num_row_);
    calculateRowValuesQuad(model, sol);
    temp_basis.valid = true;
    temp_basis.useful = true;
    refineBasis(model, temp_sol, temp_basis);
    Highs highs;
    highs.passOptions(options);
    highs.passModel(model);
    temp_basis.debug_origin_name = "HPresolve::debug";
    highs.setBasis(temp_basis);
    // highs.writeModel("model.mps");
    // highs.writeBasis("bad.bas");
    highs.run();
    printf("simplex iterations with postsolved basis: %" HIGHSINT_FORMAT "\n",
           highs.getInfo().simplex_iteration_count);
    checkResult = highs.getInfo().simplex_iteration_count == 0;
#else

    if (reductionLim == good) break;

    Aend.assign(model.a_matrix_.start_.begin() + 1,
                model.a_matrix_.start_.end());
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart, ARindex, ARvalue);
    sol = reducedsol;
    basis = reducedbasis;
    postsolve_stack.undoUntil(options, sol, basis, reductionLim);

    calculateRowValuesQuad(model, sol);
    kktinfo = dev_kkt_check::initInfo();
    checkResult = dev_kkt_check::checkKkt(state, kktinfo);
    checkResult = checkResult && kktinfo.pass_bfs;
#endif
    if (bad == good - 1) break;

    if (checkResult) {
      good = reductionLim;
    } else {
      bad = reductionLim;
    }
    reductionLim = (bad + good) / 2;
    printf("binary search ongoing: good=%zu, bad=%zu\n", good, bad);
  } while (true);

  printf("binary search finished: good=%zu, bad=%zu\n", good, bad);
  assert(false);
}